

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O0

BCIns * lj_snap_restore(jit_State *J,void *exptr)

{
  char cVar1;
  uint uVar2;
  SnapEntry SVar3;
  SnapEntry SVar4;
  SnapEntry *pSVar5;
  ulong uVar6;
  IRIns *pIVar7;
  uint uVar8;
  uint snapno_00;
  jit_State *T_00;
  GCtrace *pGVar9;
  uint *puVar10;
  IRIns *rfilt_00;
  IRIns *in_RSI;
  long in_RDI;
  TValue *in_stack_00000020;
  MSize j;
  IRIns *ir;
  IRRef ref;
  TValue *o;
  SnapEntry sn;
  lua_State *L;
  BCIns *pc;
  BloomFilter rfilt;
  TValue *frame;
  ptrdiff_t ftsz0;
  SnapEntry *flinks;
  SnapEntry *map;
  MSize nent;
  MSize n;
  SnapShot *snap;
  GCtrace *T;
  SnapNo snapno;
  ExitState *ex;
  TValue *in_stack_000000f0;
  undefined8 in_stack_fffffffffffffef8;
  MSize need;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  uint in_stack_ffffffffffffff1c;
  IRIns *ex_00;
  undefined4 in_stack_ffffffffffffff38;
  uint uVar11;
  jit_State *J_00;
  SnapEntry *local_98;
  uint local_84;
  IRIns *rfilt_01;
  ExitState *ex_01;
  GCtrace *T_01;
  jit_State *J_01;
  uint32_t local_34;
  
  need = (MSize)((ulong)in_stack_fffffffffffffef8 >> 0x20);
  T_00 = (jit_State *)
         (ulong)*(uint *)(*(long *)(in_RDI + 0x170) + (ulong)*(uint *)(in_RDI + 0x9a8) * 4);
  pGVar9 = (GCtrace *)((T_00->cur).snap + *(uint *)(in_RDI + 0x9ac));
  uVar8 = (uint)*(uint8_t *)((long)&pGVar9->nins + 2);
  pSVar5 = (T_00->cur).snapmap;
  uVar2 = (pGVar9->nextgc).gcptr32;
  if ((SnapShot *)&pGVar9->gclist == (T_00->cur).snap + (T_00->cur).nsnap) {
    local_34 = (T_00->cur).nsnapmap;
  }
  else {
    local_34 = (pGVar9->gclist).gcptr32;
  }
  local_98 = (T_00->cur).snapmap + (local_34 - 1);
  rfilt_01 = in_RSI;
  T_01 = pGVar9;
  J_01 = T_00;
  snap_renamefilter((GCtrace *)T_00,*(uint *)(in_RDI + 0x9ac));
  ex_01 = (ExitState *)(pSVar5 + (ulong)uVar2 + (ulong)uVar8);
  puVar10 = (uint *)(ulong)*(uint *)ex_01->fpr;
  J_00 = *(jit_State **)(in_RDI + 0x68);
  uVar6._0_4_ = (J_00->cur).startpt;
  uVar6._4_4_ = (J_00->cur).startpc;
  *(uint *)((uVar6 & 0xfffffffffffffffc) + 0x1c) = *(uint *)ex_01->fpr + 4;
  if ((IRIns *)(ulong)*(uint *)&(J_00->cur).snap <=
      (J_00->cur).ir + (int)(uint)*(uint8_t *)((long)&pGVar9->nins + 1)) {
    *(IRIns **)&(J_00->cur).nk =
         (J_00->cur).ir +
         (int)(uint)*(byte *)((ulong)*(uint *)((ulong)(J_00->cur).ir[-1].field_1.op12 + 0x10) - 0x39
                             );
    lj_state_growstack((lua_State *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                       need);
  }
  pIVar7 = (J_00->cur).ir;
  SVar3 = *(SnapEntry *)((long)pIVar7 + -4);
  local_84 = 0;
  do {
    if (uVar8 <= local_84) {
      cVar1 = (char)*puVar10;
      if ((((cVar1 == '?') || (cVar1 == 'A')) || (cVar1 == 'C')) ||
         ((cVar1 == 'I' || (0x58 < (*puVar10 & 0xff))))) {
        *(IRIns **)&(J_00->cur).nk = pIVar7 + (long)(int)(uint)(byte)pGVar9->nins + -1;
      }
      else {
        *(IRIns **)&(J_00->cur).nk =
             (J_00->cur).ir +
             (int)(uint)*(byte *)((ulong)*(uint *)((ulong)(J_00->cur).ir[-1].field_1.op12 + 0x10) -
                                 0x39);
      }
      *(long *)(in_RDI + 0x9f8) = *(long *)(in_RDI + 0x9f8) + 1;
      return puVar10;
    }
    uVar11 = pSVar5[(ulong)uVar2 + (ulong)local_84];
    if ((uVar11 & 0x40000) == 0) {
      ex_00 = pIVar7 + ((ulong)(uVar11 >> 0x18) - 1);
      snapno_00 = uVar11 & 0xffff;
      rfilt_00 = (T_00->cur).ir + snapno_00;
      if ((rfilt_00->field_1).r == 0xfd) {
        for (in_stack_ffffffffffffff1c = 0; in_stack_ffffffffffffff1c < local_84;
            in_stack_ffffffffffffff1c = in_stack_ffffffffffffff1c + 1) {
          if ((pSVar5[(ulong)uVar2 + (ulong)in_stack_ffffffffffffff1c] & 0xffff) == snapno_00) {
            *ex_00 = pIVar7[(ulong)(pSVar5[(ulong)uVar2 + (ulong)in_stack_ffffffffffffff1c] >> 0x18)
                            - 1];
            goto LAB_001ab016;
          }
        }
        snap_unsink(J_01,T_01,ex_01,(SnapNo)((ulong)in_RDI >> 0x20),(BloomFilter)rfilt_01,in_RSI,
                    in_stack_000000f0);
      }
      else {
        snap_restoreval(J_00,(GCtrace *)CONCAT44(uVar11,in_stack_ffffffffffffff38),
                        (ExitState *)&ex_00->field_0,snapno_00,(BloomFilter)rfilt_00,
                        in_stack_ffffffffffffff1c,in_stack_00000020);
        if ((uVar11 & 0x30000) != 0) {
          SVar4 = SVar3;
          if (uVar11 >> 0x18 != 0) {
            SVar4 = *local_98;
            local_98 = local_98 + -1;
          }
          *(short *)((long)ex_00 + 4) = (short)SVar4;
          *(short *)((long)ex_00 + 6) = (short)(SVar4 >> 0x10);
          (J_00->cur).ir = ex_00 + 1;
        }
      }
    }
LAB_001ab016:
    local_84 = local_84 + 1;
  } while( true );
}

Assistant:

const BCIns *lj_snap_restore(jit_State *J, void *exptr)
{
  ExitState *ex = (ExitState *)exptr;
  SnapNo snapno = J->exitno;  /* For now, snapno == exitno. */
  GCtrace *T = traceref(J, J->parent);
  SnapShot *snap = &T->snap[snapno];
  MSize n, nent = snap->nent;
  SnapEntry *map = &T->snapmap[snap->mapofs];
#if !LJ_FR2 || defined(LUA_USE_ASSERT)
  SnapEntry *flinks = &T->snapmap[snap_nextofs(T, snap)-1-LJ_FR2];
#endif
#if !LJ_FR2
  ptrdiff_t ftsz0;
#endif
  TValue *frame;
  BloomFilter rfilt = snap_renamefilter(T, snapno);
  const BCIns *pc = snap_pc(&map[nent]);
  lua_State *L = J->L;

  /* Set interpreter PC to the next PC to get correct error messages. */
  setcframe_pc(cframe_raw(L->cframe), pc+1);

  /* Make sure the stack is big enough for the slots from the snapshot. */
  if (LJ_UNLIKELY(L->base + snap->topslot >= tvref(L->maxstack))) {
    L->top = curr_topL(L);
    lj_state_growstack(L, snap->topslot - curr_proto(L)->framesize);
  }

  /* Fill stack slots with data from the registers and spill slots. */
  frame = L->base-1-LJ_FR2;
#if !LJ_FR2
  ftsz0 = frame_ftsz(frame);  /* Preserve link to previous frame in slot #0. */
#endif
  for (n = 0; n < nent; n++) {
    SnapEntry sn = map[n];
    if (!(sn & SNAP_NORESTORE)) {
      TValue *o = &frame[snap_slot(sn)];
      IRRef ref = snap_ref(sn);
      IRIns *ir = &T->ir[ref];
      if (ir->r == RID_SUNK) {
	MSize j;
	for (j = 0; j < n; j++)
	  if (snap_ref(map[j]) == ref) {  /* De-duplicate sunk allocations. */
	    copyTV(L, o, &frame[snap_slot(map[j])]);
	    goto dupslot;
	  }
	snap_unsink(J, T, ex, snapno, rfilt, ir, o);
      dupslot:
	continue;
      }
      snap_restoreval(J, T, ex, snapno, rfilt, ref, o);
      if (LJ_SOFTFP32 && (sn & SNAP_SOFTFPNUM) && tvisint(o)) {
	TValue tmp;
	snap_restoreval(J, T, ex, snapno, rfilt, ref+1, &tmp);
	o->u32.hi = tmp.u32.lo;
#if !LJ_FR2
      } else if ((sn & (SNAP_CONT|SNAP_FRAME))) {
	/* Overwrite tag with frame link. */
	setframe_ftsz(o, snap_slot(sn) != 0 ? (int32_t)*flinks-- : ftsz0);
	L->base = o+1;
#endif
      }
    }
  }
#if LJ_FR2
  L->base += (map[nent+LJ_BE] & 0xff);
#endif
  lj_assertJ(map + nent == flinks, "inconsistent frames in snapshot");

  /* Compute current stack top. */
  switch (bc_op(*pc)) {
  default:
    if (bc_op(*pc) < BC_FUNCF) {
      L->top = curr_topL(L);
      break;
    }
    /* fallthrough */
  case BC_CALLM: case BC_CALLMT: case BC_RETM: case BC_TSETM:
    L->top = frame + snap->nslots;
    break;
  }
  J->nsnaprestore++;
  return pc;
}